

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

int64_t __thiscall
aeron::ClientConductor::addSubscription
          (ClientConductor *this,string *channel,int32_t streamId,
          on_available_image_t *onAvailableImageHandler,
          on_unavailable_image_t *onUnavailableImageHandler)

{
  int64_t iVar1;
  int iVar2;
  int64_t registrationId;
  int32_t local_3c;
  int64_t local_38;
  longlong local_30;
  
  local_3c = streamId;
  verifyDriverIsActive(this);
  ensureOpen(this);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  local_38 = DriverProxy::addSubscription(this->m_driverProxy,channel,local_3c);
  if ((this->m_epochClock).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_30 = (*(this->m_epochClock)._M_invoker)((_Any_data *)&this->m_epochClock);
    std::
    vector<aeron::ClientConductor::SubscriptionStateDefn,std::allocator<aeron::ClientConductor::SubscriptionStateDefn>>
    ::
    emplace_back<std::__cxx11::string_const&,long&,int&,long_long,std::function<void(aeron::Image&)>const&,std::function<void(aeron::Image&)>const&>
              ((vector<aeron::ClientConductor::SubscriptionStateDefn,std::allocator<aeron::ClientConductor::SubscriptionStateDefn>>
                *)&this->m_subscriptions,channel,&local_38,&local_3c,&local_30,
               onAvailableImageHandler,onUnavailableImageHandler);
    iVar1 = local_38;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
    return iVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

std::int64_t ClientConductor::addSubscription(
    const std::string &channel,
    std::int32_t streamId,
    const on_available_image_t &onAvailableImageHandler,
    const on_unavailable_image_t &onUnavailableImageHandler)
{
    verifyDriverIsActive();
    ensureOpen();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    std::int64_t registrationId = m_driverProxy.addSubscription(channel, streamId);

    m_subscriptions.emplace_back(
        channel, registrationId, streamId, m_epochClock(), onAvailableImageHandler, onUnavailableImageHandler);

    return registrationId;
}